

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O0

int __thiscall ncnn::RNN::load_model(RNN *this,ModelBin *mb)

{
  undefined4 uVar1;
  ulong uVar2;
  bool bVar3;
  long *in_RSI;
  Mat *in_RDI;
  int size;
  int num_directions;
  Mat *in_stack_fffffffffffffee0;
  Mat *m;
  undefined1 local_108 [72];
  Mat local_c0;
  undefined1 local_68 [72];
  undefined4 local_20;
  int local_1c;
  long *local_18;
  int local_4;
  
  local_1c = (*(int *)&in_RDI[3].data == 2) + 1;
  uVar2 = (long)*(int *)((long)&in_RDI[2].cstep + 4) / (long)local_1c;
  uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
          (long)(int)in_RDI[2].cstep;
  local_20 = (undefined4)uVar2;
  local_18 = in_RSI;
  (**(code **)(*in_RSI + 0x20))(local_68,in_RSI,uVar2 & 0xffffffff,(int)in_RDI[2].cstep,local_1c,0);
  ncnn::Mat::operator=(in_RDI,in_stack_fffffffffffffee0);
  ncnn::Mat::~Mat((Mat *)0x51f1fe);
  bVar3 = ncnn::Mat::empty(in_stack_fffffffffffffee0);
  if (bVar3) {
    local_4 = -100;
  }
  else {
    m = &local_c0;
    (**(code **)(*local_18 + 0x20))(m,local_18,(int)in_RDI[2].cstep,1,local_1c,0);
    ncnn::Mat::operator=(in_RDI,m);
    ncnn::Mat::~Mat((Mat *)0x51f2a3);
    bVar3 = ncnn::Mat::empty(m);
    if (bVar3) {
      local_4 = -100;
    }
    else {
      uVar1 = (undefined4)in_RDI[2].cstep;
      (**(code **)(*local_18 + 0x20))(local_108,local_18,uVar1,uVar1,local_1c,0,local_108);
      ncnn::Mat::operator=(in_RDI,m);
      ncnn::Mat::~Mat((Mat *)0x51f340);
      bVar3 = ncnn::Mat::empty(m);
      if (bVar3) {
        local_4 = -100;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int RNN::load_model(const ModelBin& mb)
{
    int num_directions = direction == 2 ? 2 : 1;

    int size = weight_data_size / num_directions / num_output;

    // raw weight data
    weight_xc_data = mb.load(size, num_output, num_directions, 0);
    if (weight_xc_data.empty())
        return -100;

    bias_c_data = mb.load(num_output, 1, num_directions, 0);
    if (bias_c_data.empty())
        return -100;

    weight_hc_data = mb.load(num_output, num_output, num_directions, 0);
    if (weight_hc_data.empty())
        return -100;

    return 0;
}